

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

residue * newResidueData(void)

{
  residue *prVar1;
  
  prVar1 = (residue *)malloc(0x40);
  if (prVar1 != (residue *)0x0) {
    prVar1->nextRes = (residue_t *)0x0;
    prVar1->a = (atom *)0x0;
    prVar1->resid = 0x20;
    prVar1->resInsCode = ' ';
    prVar1->chain[0] = ' ';
    prVar1->chain[1] = ' ';
    prVar1->chain[2] = '\0';
    prVar1->rescnt = 0;
    prVar1->segid[0] = '\0';
    prVar1->ring = (ringInfo *)0x0;
    prVar1->file = 0;
    prVar1->model = 0;
  }
  return prVar1;
}

Assistant:

residue * newResidueData()
{ /* new blank residue */
   residue *r = NULL;
   r = (residue *)malloc(sizeof(residue));
   if (r) {
      r->nextRes = NULL;
      r->a = NULL;
      r->file = 0;
      r->model = 0;
      //r->chain[0] = ' ';   /*RMI I don't know what to do here*/
      r->chain[0] = ' ';
      r->chain[1] = ' ';
      r->chain[2] = '\0';
      r->resid = ' ';
      r->resInsCode = ' ';
      r->rescnt = 0;
      r->segid[0] = '\0';

      r->ring = NULL;
   }
   return r;
}